

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

htab_hash_t proto_hash(MIR_item_t pi,void *arg)

{
  MIR_type_t *pMVar1;
  int *piVar2;
  byte *pbVar3;
  node_t_conflict pnVar4;
  int *piVar5;
  gen_ctx_conflict *pgVar6;
  VARR_MIR_var_t *pVVar7;
  VARR_MIR_type_t *pVVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  int iVar28;
  uint uVar29;
  int iVar30;
  MIR_type_t MVar31;
  ulong uVar32;
  MIR_var_t *extraout_RAX;
  MIR_var_t *__ptr;
  mir_size_t mVar33;
  c2m_ctx_t pcVar34;
  MIR_type_t MVar35;
  ulong uVar36;
  ulong uVar37;
  char *suffix;
  uint8_t *v;
  ulong *puVar38;
  MIR_type_t promoted_type;
  ulong uVar39;
  type *ret_type;
  type *ptVar40;
  MIR_proto_t pMVar41;
  c2m_ctx_t pcVar42;
  c2m_ctx_t pcVar43;
  ulong uVar44;
  node_t_conflict pnVar45;
  char *pcVar46;
  long lVar47;
  size_t sVar48;
  int *piVar49;
  bool bVar50;
  target_arg_info_t tStack_e0;
  gen_ctx_conflict *pgStack_d8;
  MIR_type_t aMStack_d0 [2];
  c2m_ctx_t pcStack_c8;
  
  pMVar41 = (pi->u).proto;
  ret_type = (type *)pMVar41->args;
  if (ret_type != (type *)0x0) {
    uVar36 = CONCAT44(0,pMVar41->nres);
    auVar9._8_8_ = 0;
    auVar9._0_8_ = uVar36;
    uVar32 = SUB168(auVar9 * ZEXT816(0x65862b62bdf5ef4d),8) +
             SUB168(auVar9 * ZEXT816(0x65862b62bdf5ef4d),0) ^ 0x2a;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = uVar32;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = (long)pMVar41->vararg_p;
    uVar32 = SUB168(auVar11 * ZEXT816(0x65862b62bdf5ef4d),8) +
             SUB168(auVar11 * ZEXT816(0x65862b62bdf5ef4d),0) ^ uVar32 ^
             SUB168(auVar10 * ZEXT816(0x288eea216831e6a7),8) +
             SUB168(auVar10 * ZEXT816(0x288eea216831e6a7),0);
    auVar12._8_8_ = 0;
    auVar12._0_8_ = uVar32;
    uVar32 = SUB168(auVar12 * ZEXT816(0x288eea216831e6a7),8) +
             SUB168(auVar12 * ZEXT816(0x288eea216831e6a7),0) ^ uVar32;
    if (uVar36 != 0) {
      uVar44 = 0;
      do {
        pMVar1 = pMVar41->res_types + uVar44;
        uVar44 = uVar44 + 1;
        auVar9 = ZEXT416(*pMVar1) * ZEXT816(0x65862b62bdf5ef4d);
        uVar32 = auVar9._8_8_ + auVar9._0_8_ ^ uVar32;
        auVar13._8_8_ = 0;
        auVar13._0_8_ = uVar32;
        uVar32 = SUB168(auVar13 * ZEXT816(0x288eea216831e6a7),8) +
                 SUB168(auVar13 * ZEXT816(0x288eea216831e6a7),0) ^ uVar32;
      } while (uVar36 != uVar44);
    }
    pnVar4 = ret_type->pos_node;
    if (pnVar4 != (node_t_conflict)0x0) {
      lVar47 = *(long *)&ret_type->antialias;
      pnVar45 = (node_t_conflict)0x0;
      do {
        uVar29 = *(uint *)(lVar47 + (long)pnVar45 * 0x18);
        puVar38 = *(ulong **)(lVar47 + 8 + (long)pnVar45 * 0x18);
        auVar9 = ZEXT416(uVar29) * ZEXT816(0x65862b62bdf5ef4d);
        uVar32 = auVar9._8_8_ + auVar9._0_8_ ^ uVar32;
        auVar14._8_8_ = 0;
        auVar14._0_8_ = uVar32;
        uVar44 = strlen((char *)puVar38);
        uVar36 = uVar44 + 0x18;
        for (; 0xf < uVar44; uVar44 = uVar44 - 0x10) {
          auVar24._8_8_ = 0;
          auVar24._0_8_ = *puVar38;
          auVar25._8_8_ = 0;
          auVar25._0_8_ = puVar38[1];
          puVar38 = puVar38 + 2;
          uVar36 = SUB168(ZEXT816(0x288eea216831e6a7) * auVar25,8) +
                   SUB168(ZEXT816(0x288eea216831e6a7) * auVar25,0) ^
                   SUB168(ZEXT816(0x65862b62bdf5ef4d) * auVar24,8) +
                   SUB168(ZEXT816(0x65862b62bdf5ef4d) * auVar24,0) ^ uVar36;
          auVar15._8_8_ = 0;
          auVar15._0_8_ = uVar36;
          uVar36 = SUB168(auVar15 * ZEXT816(0x65862b62bdf5ef4d),8) +
                   SUB168(auVar15 * ZEXT816(0x65862b62bdf5ef4d),0) ^ uVar36;
        }
        if (7 < uVar44) {
          auVar26._8_8_ = 0;
          auVar26._0_8_ = *puVar38;
          uVar44 = uVar44 - 8;
          puVar38 = puVar38 + 1;
          uVar36 = uVar36 ^ SUB168(ZEXT816(0x65862b62bdf5ef4d) * auVar26,8) +
                            SUB168(ZEXT816(0x65862b62bdf5ef4d) * auVar26,0);
        }
        if (uVar44 != 0) {
          if (uVar44 < 4) {
            uVar39 = 0;
            uVar37 = 0;
          }
          else {
            uVar39 = 4;
            uVar37 = (ulong)(uint)*puVar38 << 0x20;
          }
          if (uVar39 < uVar44) {
            do {
              pbVar3 = (byte *)((long)puVar38 + uVar39);
              uVar39 = uVar39 + 1;
              uVar37 = uVar37 >> 8 | (ulong)*pbVar3 << 0x38;
            } while (uVar44 != uVar39);
          }
          auVar16._8_8_ = 0;
          auVar16._0_8_ = uVar37;
          uVar36 = uVar36 ^ SUB168(auVar16 * ZEXT816(0x288eea216831e6a7),8) +
                            SUB168(auVar16 * ZEXT816(0x288eea216831e6a7),0);
        }
        auVar17._8_8_ = 0;
        auVar17._0_8_ = uVar36;
        uVar36 = SUB168(auVar17 * ZEXT816(0x65862b62bdf5ef4d),8) +
                 SUB168(auVar17 * ZEXT816(0x65862b62bdf5ef4d),0) ^ uVar36;
        auVar18._8_8_ = 0;
        auVar18._0_8_ = uVar36;
        auVar19._8_8_ = 0;
        auVar19._0_8_ =
             SUB168(auVar18 * ZEXT816(0x288eea216831e6a7),8) +
             SUB168(auVar18 * ZEXT816(0x288eea216831e6a7),0) ^ uVar36;
        uVar32 = SUB168(auVar14 * ZEXT816(0x288eea216831e6a7),8) +
                 SUB168(auVar14 * ZEXT816(0x288eea216831e6a7),0) ^ uVar32 ^
                 SUB168(auVar19 * ZEXT816(0x65862b62bdf5ef4d),8) +
                 SUB168(auVar19 * ZEXT816(0x65862b62bdf5ef4d),0);
        auVar20._8_8_ = 0;
        auVar20._0_8_ = uVar32;
        uVar32 = SUB168(auVar20 * ZEXT816(0x288eea216831e6a7),8) +
                 SUB168(auVar20 * ZEXT816(0x288eea216831e6a7),0) ^ uVar32;
        if (0xfffffff9 < uVar29 - 0x12) {
          auVar27._8_8_ = 0;
          auVar27._0_8_ = *(ulong *)(lVar47 + (long)pnVar45 * 0x18 + 0x10);
          uVar32 = SUB168(ZEXT816(0x65862b62bdf5ef4d) * auVar27,8) +
                   SUB168(ZEXT816(0x65862b62bdf5ef4d) * auVar27,0) ^ uVar32;
          auVar21._8_8_ = 0;
          auVar21._0_8_ = uVar32;
          uVar32 = SUB168(auVar21 * ZEXT816(0x288eea216831e6a7),8) +
                   SUB168(auVar21 * ZEXT816(0x288eea216831e6a7),0) ^ uVar32;
        }
        pnVar45 = (node_t_conflict)((long)&pnVar45->code + 1);
      } while (pnVar45 != pnVar4);
    }
    auVar22._8_8_ = 0;
    auVar22._0_8_ = uVar32;
    uVar32 = SUB168(auVar22 * ZEXT816(0x65862b62bdf5ef4d),8) +
             SUB168(auVar22 * ZEXT816(0x65862b62bdf5ef4d),0) ^ uVar32;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = uVar32;
    return (uint)uVar32 ^
           SUB164(auVar23 * ZEXT816(0x288eea216831e6a7),8) +
           SUB164(auVar23 * ZEXT816(0x288eea216831e6a7),0);
  }
  proto_hash_cold_1();
  pcVar42 = *(c2m_ctx_t *)&pMVar41[1].vararg_p;
  ptVar40 = ret_type[1].arr_type;
  uVar29 = *(uint *)&pcVar42->options;
  if ((uVar29 != *(uint *)&ptVar40->arr_type) ||
     ((char)pcVar42->env[0].__jmpbuf[1] != (char)ptVar40->mode)) {
    return 0;
  }
  puVar38 = (ulong *)pcVar42->env[0].__jmpbuf[2];
  if (puVar38 == (ulong *)0x0) {
    proto_eq_cold_2();
  }
  else {
    ret_type = *(type **)&ptVar40->align;
    if (ret_type != (type *)0x0) {
      pnVar4 = (node_t_conflict)*puVar38;
      if (pnVar4 != ret_type->pos_node) {
        return 0;
      }
      if ((ulong)uVar29 != 0) {
        uVar32 = 0;
        do {
          if (*(int *)(pcVar42->env[0].__jmpbuf[0] + uVar32 * 4) !=
              *(int *)(*(long *)&ptVar40->antialias + uVar32 * 4)) {
            return 0;
          }
          uVar32 = uVar32 + 1;
        } while (uVar29 != uVar32);
      }
      if (pnVar4 == (node_t_conflict)0x0) {
        return 1;
      }
      piVar49 = (int *)puVar38[2];
      piVar5 = *(int **)&ret_type->antialias;
      iVar30 = *piVar49;
      if (iVar30 != *piVar5) {
        return 0;
      }
      pnVar45 = (node_t_conflict)0x1;
      bVar50 = false;
      lVar47 = 0x18;
      do {
        iVar28 = strcmp(*(char **)((long)piVar49 + lVar47 + -0x10),
                        *(char **)((long)piVar5 + lVar47 + -0x10));
        if ((iVar28 != 0) ||
           (((0xfffffff9 < iVar30 - 0x12U &&
             (*(long *)((long)piVar49 + lVar47 + -8) != *(long *)((long)piVar5 + lVar47 + -8))) ||
            (bVar50 = pnVar4 <= pnVar45, pnVar45 == pnVar4)))) break;
        iVar30 = *(int *)((long)piVar49 + lVar47);
        pnVar45 = (node_t_conflict)((long)&pnVar45->code + 1);
        piVar2 = (int *)((long)piVar5 + lVar47);
        lVar47 = lVar47 + 0x18;
      } while (iVar30 == *piVar2);
      return (uint)bVar50;
    }
  }
  proto_eq_cold_1();
  pgVar6 = pcVar42->gen_ctx;
  pVVar7 = (pgVar6->proto_info).arg_vars;
  pgStack_d8 = pgVar6;
  if ((pVVar7 == (VARR_MIR_var_t *)0x0) || (pVVar7->varr == (MIR_var_t *)0x0)) {
LAB_0019a7a6:
    collect_args_and_func_types_cold_6();
LAB_0019a7ab:
    collect_args_and_func_types_cold_5();
  }
  else {
    piVar49 = *(int **)(*(long *)&ret_type->antialias + 0x20);
    pVVar7->els_num = 0;
    pVVar8 = (pgVar6->proto_info).ret_types;
    if ((pVVar8 == (VARR_MIR_type_t *)0x0) || (pVVar8->varr == (MIR_type_t *)0x0))
    goto LAB_0019a7ab;
    pVVar8->els_num = 0;
    (pgVar6->proto_info).res_ref_p = 0;
    tStack_e0.n_iregs = 0;
    tStack_e0.n_fregs = 0;
    set_type_layout(pcVar42,ret_type->arr_type);
    ret_type = ret_type->arr_type;
    pVVar8 = (pgVar6->proto_info).ret_types;
    pVVar7 = (pgVar6->proto_info).arg_vars;
    pcVar43 = pcVar42;
    pcStack_c8 = pcVar42;
    if ((ret_type->mode == TM_BASIC) && (__ptr = extraout_RAX, (ret_type->u).basic_type == TP_VOID))
    {
LAB_0019a5e3:
      if ((piVar49 != (int *)0x0) &&
         (((*piVar49 != 0x7b ||
           (__ptr = *(MIR_var_t **)(*(long *)(piVar49 + 2) + 0x18), __ptr[1].type != MIR_T_U8)) ||
          (__ptr[2].type != MIR_T_U8)))) {
        do {
          if (*piVar49 == 0x7b) {
            pcVar46 = "p";
            ret_type = *(type **)(*(long *)(piVar49 + 2) + 0x18);
          }
          else {
            if (((*(long *)(piVar49 + 8) == 0) || (*piVar49 != 0x55)) ||
               ((piVar5 = *(int **)(*(long *)(piVar49 + 8) + 0x18), piVar5 == (int *)0x0 ||
                (*piVar5 != 0x5d)))) {
              __assert_fail("p->code == N_SPEC_DECL && declarator != NULL && declarator->code == N_DECL"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                            ,0x2c94,
                            "void collect_args_and_func_types(c2m_ctx_t, struct func_type *)");
            }
            ret_type = *(type **)(*(long *)(piVar49 + 2) + 0x40);
            pcVar46 = get_param_name(pcVar43,ret_type,*(char **)(*(long *)(piVar5 + 8) + 0x20));
          }
          pVVar7 = (pgStack_d8->proto_info).arg_vars;
          iVar30 = process_aggregate_arg(pcVar43,ret_type,&tStack_e0,aMStack_d0);
          if ((ret_type->mode & ~TM_BASIC) == TM_STRUCT) {
            MVar35 = get_blk_type(iVar30,aMStack_d0);
            ptVar40 = ret_type;
            pcVar34 = (c2m_ctx_t)raw_type_size(pcVar43,ret_type);
            uVar32 = (ulong)ret_type->align;
            ret_type = ptVar40;
            pcVar42 = pcVar43;
            if (uVar32 != 0) {
              uVar36 = (long)pcVar34->env[0].__jmpbuf + (uVar32 - 0x11);
              pcVar34 = (c2m_ctx_t)(uVar36 - uVar36 % uVar32);
            }
          }
          else {
            pcVar42 = pcVar43;
            MVar31 = get_mir_type(pcVar43,ret_type);
            pcVar34 = pcVar43;
            if ((MVar31 & 0x1e) == MIR_T_F) {
              tStack_e0.n_fregs = tStack_e0.n_fregs + 1;
              MVar35 = MVar31;
            }
            else {
              MVar35 = MIR_T_LD;
              if (MVar31 != MIR_T_LD) {
                tStack_e0.n_iregs = tStack_e0.n_iregs + 1;
                MVar35 = MVar31;
              }
            }
          }
          __ptr = pVVar7->varr;
          if (__ptr == (MIR_var_t *)0x0) {
            collect_args_and_func_types_cold_4();
LAB_0019a7a1:
            collect_args_and_func_types_cold_1();
            goto LAB_0019a7a6;
          }
          sVar48 = pVVar7->els_num;
          uVar32 = sVar48 + 1;
          if (pVVar7->size < uVar32) {
            sVar48 = (uVar32 >> 1) + uVar32;
            __ptr = (MIR_var_t *)realloc(__ptr,sVar48 * 0x18);
            pVVar7->varr = __ptr;
            pVVar7->size = sVar48;
            sVar48 = pVVar7->els_num;
            uVar32 = sVar48 + 1;
          }
          pVVar7->els_num = uVar32;
          __ptr[sVar48].type = MVar35;
          __ptr[sVar48].name = pcVar46;
          __ptr[sVar48].size = (size_t)pcVar34;
          piVar49 = *(int **)(piVar49 + 6);
          pcVar43 = pcStack_c8;
        } while (piVar49 != (int *)0x0);
      }
      return (htab_hash_t)__ptr;
    }
    uVar29 = process_ret_type(pcVar42,ret_type,aMStack_d0);
    __ptr = (MIR_var_t *)(ulong)uVar29;
    if (uVar29 != 0) {
      if (0 < (int)uVar29) {
        uVar32 = pVVar8->els_num;
        __ptr = (MIR_var_t *)pVVar8->varr;
        uVar36 = 0;
        do {
          pcVar42 = (c2m_ctx_t)0x4;
          ret_type = (type *)0x5;
          MVar31 = aMStack_d0[uVar36];
          MVar35 = MVar31 & ~MIR_T_I16;
          if (MVar35 == MIR_T_U8) {
            MVar31 = MIR_T_U32;
          }
          if (MVar35 == MIR_T_I8) {
            MVar31 = MIR_T_I32;
          }
          if (__ptr == (MIR_var_t *)0x0) goto LAB_0019a7a1;
          uVar44 = uVar32 + 1;
          uVar37 = uVar32;
          uVar32 = uVar44;
          if (pVVar8->size < uVar44) {
            sVar48 = (uVar44 >> 1) + uVar44;
            __ptr = (MIR_var_t *)realloc(__ptr,sVar48 * 4);
            pVVar8->varr = (MIR_type_t *)__ptr;
            pVVar8->size = sVar48;
            uVar37 = pVVar8->els_num;
            uVar32 = uVar37 + 1;
            pcVar43 = pcStack_c8;
          }
          uVar36 = uVar36 + 1;
          pVVar8->els_num = uVar32;
          (&__ptr->type)[uVar37] = MVar31;
        } while (uVar29 != uVar36);
      }
      goto LAB_0019a5e3;
    }
    if ((ret_type->mode & ~TM_BASIC) != TM_STRUCT) {
      MVar31 = get_mir_type(pcVar42,ret_type);
      __ptr = (MIR_var_t *)pVVar8->varr;
      if (__ptr != (MIR_var_t *)0x0) {
        sVar48 = pVVar8->els_num;
        uVar32 = sVar48 + 1;
        if (pVVar8->size < uVar32) {
          sVar48 = (uVar32 >> 1) + uVar32;
          __ptr = (MIR_var_t *)realloc(__ptr,sVar48 * 4);
          pVVar8->varr = (MIR_type_t *)__ptr;
          pVVar8->size = sVar48;
          sVar48 = pVVar8->els_num;
          uVar32 = sVar48 + 1;
        }
        pVVar8->els_num = uVar32;
        (&__ptr->type)[sVar48] = MVar31;
        goto LAB_0019a5e3;
      }
      goto LAB_0019a7b5;
    }
    ptVar40 = ret_type;
    mVar33 = raw_type_size(pcVar42,ret_type);
    uVar32 = (ulong)ret_type->align;
    if (uVar32 != 0) {
      uVar36 = (mVar33 - 1) + uVar32;
      mVar33 = uVar36 - uVar36 % uVar32;
    }
    __ptr = pVVar7->varr;
    ret_type = ptVar40;
    if (__ptr != (MIR_var_t *)0x0) {
      sVar48 = pVVar7->els_num;
      uVar32 = sVar48 + 1;
      if (pVVar7->size < uVar32) {
        sVar48 = (uVar32 >> 1) + uVar32;
        __ptr = (MIR_var_t *)realloc(__ptr,sVar48 * 0x18);
        pVVar7->varr = __ptr;
        pVVar7->size = sVar48;
        sVar48 = pVVar7->els_num;
        uVar32 = sVar48 + 1;
      }
      pVVar7->els_num = uVar32;
      __ptr[sVar48].type = MIR_T_RBLK;
      __ptr[sVar48].name = "Ret_Addr";
      __ptr[sVar48].size = mVar33;
      tStack_e0.n_iregs = 1;
      goto LAB_0019a5e3;
    }
  }
  collect_args_and_func_types_cold_3();
LAB_0019a7b5:
  collect_args_and_func_types_cold_2();
  if (pcVar42 != (c2m_ctx_t)0x0) {
    return (htab_hash_t)pcVar42->env[0].__jmpbuf[0];
  }
  VARR_MIR_var_taddr_cold_1();
  if (pcVar42 == (c2m_ctx_t)0x0) {
    VARR_MIR_var_tlength_cold_1();
    MVar31 = MIR_T_I64;
    if ((ret_type->mode & ~TM_BASIC) != TM_STRUCT) {
      MVar31 = get_mir_type(pcVar42,ret_type);
    }
    MVar35 = MIR_T_U32;
    if ((MVar31 & 0x1d) != MIR_T_U8) {
      MVar35 = MVar31;
    }
    promoted_type = MIR_T_I32;
    if ((MVar31 & 0x1d) != MIR_T_I8) {
      promoted_type = MVar35;
    }
    pcVar46 = get_reg_var_name(pcVar42,promoted_type,suffix,0);
    return (htab_hash_t)pcVar46;
  }
  return (htab_hash_t)pcVar42->ctx;
}

Assistant:

static htab_hash_t proto_hash (MIR_item_t pi, void *arg MIR_UNUSED) {
  MIR_proto_t p = pi->u.proto;
  MIR_var_t *args = VARR_ADDR (MIR_var_t, p->args);
  uint64_t h = mir_hash_init (42);

  h = mir_hash_step (h, p->nres);
  h = mir_hash_step (h, p->vararg_p);
  for (uint32_t i = 0; i < p->nres; i++) h = mir_hash_step (h, p->res_types[i]);
  for (size_t i = 0; i < VARR_LENGTH (MIR_var_t, p->args); i++) {
    h = mir_hash_step (h, args[i].type);
    h = mir_hash_step (h, mir_hash (args[i].name, strlen (args[i].name), 24));
    if (MIR_all_blk_type_p (args[i].type)) h = mir_hash_step (h, args[i].size);
  }
  return (htab_hash_t) mir_hash_finish (h);
}